

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lc.cpp
# Opt level: O2

double __thiscall libDAI::LC::CalcCavityDist(LC *this,size_t i,string *name,Properties *opts)

{
  value vVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  Var *n;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  InferenceAlgorithm *obj;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  long lVar6;
  size_t ij;
  ulong uVar7;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> pairbeliefs;
  double local_a8;
  TFactor<double> local_a0;
  Factor Bi;
  
  TFactor<double>::TFactor(&Bi);
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (1 < CONCAT44(extraout_var,iVar2)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Initing cavity ");
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    n = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x30))
                         ((long *)CONCAT44(extraout_var_00,iVar2),i);
    poVar4 = libDAI::operator<<(poVar4,n);
    poVar4 = std::operator<<(poVar4,"(");
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_02,iVar3),i);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x70))
              (&local_a0,(long *)CONCAT44(extraout_var_01,iVar2),uVar5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," vars, ");
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_04,iVar3),i);
    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x70))
              (&pairbeliefs,(long *)CONCAT44(extraout_var_03,iVar2),uVar5);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," states)");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&pairbeliefs);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_a0);
  }
  if ((this->Props).cavity.v == UNIFORM) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_06,iVar3),i);
    (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x70))
              (&pairbeliefs,(long *)CONCAT44(extraout_var_05,iVar2),uVar5);
    TFactor<double>::TFactor(&local_a0,(VarSet *)&pairbeliefs);
    TFactor<double>::operator=(&Bi,&local_a0);
    TFactor<double>::~TFactor(&local_a0);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&pairbeliefs);
    local_a8 = 0.0;
    goto LAB_004f0c74;
  }
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  obj = newInfAlg(name,(FactorGraph *)CONCAT44(extraout_var_07,iVar2),opts);
  iVar2 = (*obj->_vptr_InferenceAlgorithm[5])(obj);
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar3) + 0x30))
                    ((long *)CONCAT44(extraout_var_09,iVar3),i);
  local_a8 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar2) + 0xa0))
                               ((long *)CONCAT44(extraout_var_08,iVar2),uVar5);
  vVar1 = (this->Props).cavity.v;
  if (vVar1 == PAIR2) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var_15,iVar3),i);
    local_a8 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_14,iVar2) + 0x70))
                                 (&local_a0,(long *)CONCAT44(extraout_var_14,iVar2),uVar5);
    calcPairBeliefsNew(&pairbeliefs,obj,&local_a0._vs,(this->Props).reinit);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_a0);
    lVar6 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)(((long)pairbeliefs.
                               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)pairbeliefs.
                              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar7 = uVar7 + 1)
    {
      TFactor<double>::operator*=
                (&Bi,(TFactor<double> *)
                     ((long)&((pairbeliefs.
                               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar6));
      lVar6 = lVar6 + 0x38;
    }
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
              (&pairbeliefs);
  }
  else {
    if (vVar1 == PAIR) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar3) + 0x30))
                        ((long *)CONCAT44(extraout_var_13,iVar3),i);
      local_a8 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar2) + 0x70))
                                   (&pairbeliefs,(long *)CONCAT44(extraout_var_12,iVar2),uVar5);
      calcMarginal2ndO(&local_a0,obj,(VarSet *)&pairbeliefs,(this->Props).reinit);
      TFactor<double>::operator=(&Bi,&local_a0);
    }
    else {
      if (vVar1 != FULL) goto LAB_004f0c5c;
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x30))
                        ((long *)CONCAT44(extraout_var_11,iVar3),i);
      local_a8 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar2) + 0x70))
                                   (&pairbeliefs,(long *)CONCAT44(extraout_var_10,iVar2),uVar5);
      calcMarginal(&local_a0,obj,(VarSet *)&pairbeliefs,(this->Props).reinit);
      TFactor<double>::operator=(&Bi,&local_a0);
    }
    TFactor<double>::~TFactor(&local_a0);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&pairbeliefs);
  }
LAB_004f0c5c:
  (*obj->_vptr_InferenceAlgorithm[8])(obj);
  (*obj->_vptr_InferenceAlgorithm[3])(obj);
LAB_004f0c74:
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  TProb<double>::normalize(&Bi._p,*(NormType *)(CONCAT44(extraout_var_16,iVar2) + 8));
  TFactor<double>::operator=
            ((this->_cavitydists).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + i,&Bi);
  TFactor<double>::~TFactor(&Bi);
  return local_a8;
}

Assistant:

double LC::CalcCavityDist (size_t i, const std::string &name, const Properties &opts) {
        Factor Bi;
        double maxdiff = 0;

        if( Verbose() >= 2 )
            cout << "Initing cavity " << grm().var(i) << "(" << grm().delta(grm().var(i)).size() << " vars, " << grm().delta(grm().var(i)).stateSpace() << " states)" << endl;

        if( Props.cavity == CavityType::UNIFORM )
            Bi = Factor(grm().delta(grm().var(i)));
/*        else if( Props.cavity == CavityType::FULLCLUSTER ) {
            vector<Factor> facs;
            Var vi = grm().var(i);
            VarSet di = grm().delta(vi);
            VarSet Di = grm().Delta(vi);

            // construct new supervariable out of di
            long label = 0;
            for( size_t j = 0; j < grm().nrVars(); j++ )
                if( grm().var(j).label() >= label )
                    label = grm().var(j).label() + 1;
            Var new_di( label, di.stateSpace() );
            if( Verbose() >= 3 )
                cout << "new supervar " << new_di << " instead of " << di << endl;

            for( size_t I = 0; I < grm().nrFactors(); I++ ) {
                VarSet Ivars = grm().factor(I).vars();
                if( !(Ivars && Di) ) {
                    facs.push_back( grm().factor(I) );
                    if( Verbose() >= 3 )
                        cout << Ivars << endl;
                } else if( !(Ivars >> vi) ) {
                    Factor tmpI = grm().factor(I).embed( Ivars | di );
                    vector<double> values;
                    for( size_t di_state = 0; di_state < di.stateSpace(); di_state++ ) {
                        // copy slice
                        Prob sl = tmpI.slice( di, di_state ).p();
                        values.insert( values.end(), sl.p().begin(), sl.p().end() );
                    }
                    facs.push_back( Factor((Ivars / di) | new_di, &(values[0])) );
                    if( Verbose() >= 3 )
                        cout << "super: " << ((Ivars / di) | new_di) << endl;
                } else {
                    if( Verbose() >= 3 )
                        cout << "dropping " << Ivars << endl;
                }
            }
            FactorGraph fg(facs);
            InferenceAlgorithm *cav = newInfAlg( name, fg, opts );
            cav->init();
            cav->run();
            Prob Bivalues = cav->belief( new_di ).p();
            Bi = Factor( di, Bivalues );
            if( Verbose() >= 2 ) {
                cout << Bi << endl;

                InferenceAlgorithm *cav2 = newInfAlg( name, grm(), opts );
                cav2->grm().makeCavity( vi );
                cav2->init();
                cav2->run();
                Factor Bi2;
                for( VarSet::const_iterator j = di.begin(); j != di.end(); j++ )
                    Bi2 *= cav2->belief( *j );

                cout << Bi2 << endl;
            }
        } */
        else {
            InferenceAlgorithm *cav = newInfAlg( name, grm(), opts );
            cav->grm().makeCavity( grm().var(i) );

            if( Props.cavity == CavityType::FULL )
                Bi = calcMarginal( *cav, grm().delta(grm().var(i)), Props.reinit );
            else if( Props.cavity == CavityType::PAIR )
                Bi = calcMarginal2ndO( *cav, grm().delta(grm().var(i)), Props.reinit );
            else if( Props.cavity == CavityType::PAIR2 ) {
                vector<Factor> pairbeliefs = calcPairBeliefsNew( *cav, grm().delta(grm().var(i)), Props.reinit );
                for( size_t ij = 0; ij < pairbeliefs.size(); ij++ )
                    Bi *= pairbeliefs[ij];
            }
            maxdiff = cav->maxDiff();
            delete cav;
        }
        Bi.normalize( grm().normType() );
        _cavitydists[i] = Bi;

        return maxdiff;
    }